

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcCoveringType::~IfcCoveringType(IfcCoveringType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x86eb18;
  *(undefined8 *)&this->field_0x1c0 = 0x86ec30;
  *(undefined8 *)&this->field_0x88 = 0x86eb40;
  *(undefined8 *)&this->field_0x98 = 0x86eb68;
  *(undefined8 *)&this->field_0xf0 = 0x86eb90;
  *(undefined8 *)&this->field_0x148 = 0x86ebb8;
  *(undefined8 *)&this->field_0x180 = 0x86ebe0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x86ec08;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>).
                 field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x86eef8;
  *(undefined8 *)&this->field_0x1c0 = 0x86efc0;
  *(undefined8 *)&this->field_0x88 = 0x86ef20;
  *(undefined8 *)&this->field_0x98 = 0x86ef48;
  *(undefined8 *)&this->field_0xf0 = 0x86ef70;
  *(undefined8 *)&this->field_0x148 = 0x86ef98;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__0086ec58);
  operator_delete(this);
  return;
}

Assistant:

IfcCoveringType() : Object("IfcCoveringType") {}